

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O3

void __thiscall btTriangleMesh::addIndex(btTriangleMesh *this,int index)

{
  uint *ptr;
  unsigned_short *ptr_00;
  uint uVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  int iVar5;
  int *piVar6;
  
  if (this->m_use32bitIndices != true) {
    piVar6 = &(this->m_16bitIndices).m_size;
    uVar1 = (this->m_16bitIndices).m_size;
    if (uVar1 == (this->m_16bitIndices).m_capacity) {
      iVar5 = 1;
      if (uVar1 != 0) {
        iVar5 = uVar1 * 2;
      }
      if ((int)uVar1 < iVar5) {
        if (iVar5 == 0) {
          puVar3 = (unsigned_short *)0x0;
        }
        else {
          puVar3 = (unsigned_short *)btAlignedAllocInternal((long)iVar5 * 2,0x10);
          uVar1 = *piVar6;
        }
        ptr_00 = (this->m_16bitIndices).m_data;
        if ((int)uVar1 < 1) {
          if (ptr_00 != (unsigned_short *)0x0) goto LAB_0016bf4b;
        }
        else {
          uVar4 = 0;
          do {
            puVar3[uVar4] = ptr_00[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
LAB_0016bf4b:
          if ((this->m_16bitIndices).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr_00);
            uVar1 = *piVar6;
          }
        }
        (this->m_16bitIndices).m_ownsMemory = true;
        (this->m_16bitIndices).m_data = puVar3;
        (this->m_16bitIndices).m_capacity = iVar5;
      }
    }
    puVar2 = (uint *)(this->m_16bitIndices).m_data;
    *(short *)((long)puVar2 + (long)(int)uVar1 * 2) = (short)index;
    goto LAB_0016bf7f;
  }
  piVar6 = &(this->m_32bitIndices).m_size;
  uVar1 = (this->m_32bitIndices).m_size;
  if (uVar1 == (this->m_32bitIndices).m_capacity) {
    iVar5 = 1;
    if (uVar1 != 0) {
      iVar5 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar5) {
      if (iVar5 == 0) {
        puVar2 = (uint *)0x0;
      }
      else {
        puVar2 = (uint *)btAlignedAllocInternal((long)iVar5 << 2,0x10);
        uVar1 = *piVar6;
      }
      ptr = (this->m_32bitIndices).m_data;
      if ((int)uVar1 < 1) {
        if (ptr != (uint *)0x0) goto LAB_0016bf0c;
      }
      else {
        uVar4 = 0;
        do {
          puVar2[uVar4] = ptr[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
LAB_0016bf0c:
        if ((this->m_32bitIndices).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        uVar1 = *piVar6;
      }
      (this->m_32bitIndices).m_ownsMemory = true;
      (this->m_32bitIndices).m_data = puVar2;
      (this->m_32bitIndices).m_capacity = iVar5;
    }
  }
  puVar2 = (this->m_32bitIndices).m_data;
  puVar2[(int)uVar1] = index;
  uVar1 = (this->m_32bitIndices).m_size;
LAB_0016bf7f:
  *piVar6 = uVar1 + 1;
  ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_triangleIndexBase =
       (uchar *)puVar2;
  return;
}

Assistant:

void	btTriangleMesh::addIndex(int index)
{
	if (m_use32bitIndices)
	{
		m_32bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_32bitIndices[0];
	} else
	{
		m_16bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_16bitIndices[0];
	}
}